

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwaitcondition_unix.cpp
# Opt level: O0

__pid_t __thiscall QWaitCondition::wait(QWaitCondition *this,void *__stat_loc)

{
  long lVar1;
  __pid_t _Var2;
  void *in_RDX;
  long in_FS_OFFSET;
  bool returnValue;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  byte local_29;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (__stat_loc == (void *)0x0) {
    local_29 = 0;
  }
  else {
    pthread_mutex_lock((pthread_mutex_t *)this->d);
    qt_report_pthread_error
              ((int)((ulong)this >> 0x20),
               (char *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),
               (char *)0x6d9b58);
    this->d->waiters = this->d->waiters + 1;
    QBasicMutex::unlock((QBasicMutex *)__stat_loc);
    _Var2 = QWaitConditionPrivate::wait(this->d,in_RDX);
    local_29 = (byte)_Var2 & 1;
    QBasicMutex::lock((QBasicMutex *)this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (__pid_t)CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),local_29);
  }
  __stack_chk_fail();
}

Assistant:

bool QWaitCondition::wait(QMutex *mutex, QDeadlineTimer deadline)
{
    if (!mutex)
        return false;

    qt_report_pthread_error(pthread_mutex_lock(&d->mutex), "QWaitCondition::wait()", "mutex lock");
    ++d->waiters;
    mutex->unlock();

    bool returnValue = d->wait(deadline);

    mutex->lock();

    return returnValue;
}